

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_sub_tet_complexity
          (REF_INT n0,REF_INT n1,REF_INT n2,REF_INT n3,REF_INT *nodes,REF_DBL *metric,
          REF_DBL *complexity,REF_NODE ref_node)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  REF_DBL det;
  double local_58;
  double local_50;
  REF_INT local_48 [6];
  
  local_48[0] = nodes[(uint)n0];
  local_48[1] = nodes[(uint)n1];
  local_48[2] = nodes[(uint)n2];
  local_48[3] = nodes[(uint)n3];
  uVar1 = ref_node_tet_vol(ref_node,local_48,&local_50);
  if (uVar1 == 0) {
    lVar4 = 0;
    do {
      if (ref_node->ref_mpi->id == ref_node->part[local_48[lVar4]]) {
        uVar1 = ref_matrix_det_m(metric + (long)local_48[lVar4] * 6,&local_58);
        if (uVar1 != 0) {
          pcVar3 = "det";
          uVar2 = 0x740;
          goto LAB_0019377d;
        }
        if (0.0 < local_58) {
          if (local_58 < 0.0) {
            dVar5 = sqrt(local_58);
          }
          else {
            dVar5 = SQRT(local_58);
          }
          *complexity = dVar5 * local_50 * 0.25 + *complexity;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    uVar1 = 0;
  }
  else {
    pcVar3 = "vol";
    uVar2 = 0x73d;
LAB_0019377d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar2,
           "ref_metric_sub_tet_complexity",(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_sub_tet_complexity(
    REF_INT n0, REF_INT n1, REF_INT n2, REF_INT n3, REF_INT *nodes,
    REF_DBL *metric, REF_DBL *complexity, REF_NODE ref_node) {
  REF_DBL volume, det;
  REF_INT cell_node;
  REF_INT tet_nodes[4];
  tet_nodes[0] = nodes[n0];
  tet_nodes[1] = nodes[n1];
  tet_nodes[2] = nodes[n2];
  tet_nodes[3] = nodes[n3];
  RSS(ref_node_tet_vol(ref_node, tet_nodes, &volume), "vol");
  for (cell_node = 0; cell_node < 4; cell_node++) {
    if (ref_node_owned(ref_node, tet_nodes[cell_node])) {
      RSS(ref_matrix_det_m(&(metric[6 * tet_nodes[cell_node]]), &det), "det");
      if (det > 0.0) {
        (*complexity) += sqrt(det) * volume / 4.0;
      }
    }
  }

  return REF_SUCCESS;
}